

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

int fwd_aa_tab_clear(jit_State *J,IRRef lim,IRRef ta)

{
  ushort uVar1;
  AliasRet AVar2;
  ushort *puVar3;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  IRIns *calls;
  jit_State *in_stack_00000008;
  IRRef ref;
  uint local_1c;
  
  uVar1 = *(ushort *)(in_RDI + 0x242);
  while( true ) {
    local_1c = (uint)uVar1;
    if (local_1c <= in_ESI) {
      return 1;
    }
    puVar3 = (ushort *)(*(long *)(in_RDI + 0x10) + (ulong)local_1c * 8);
    if ((puVar3[1] == 0x1c) &&
       ((in_EDX == *puVar3 ||
        (AVar2 = aa_table(in_stack_00000008,calls._4_4_,(IRRef)calls), AVar2 != ALIAS_NO)))) break;
    uVar1 = puVar3[3];
  }
  return 0;
}

Assistant:

static int fwd_aa_tab_clear(jit_State *J, IRRef lim, IRRef ta)
{
  IRRef ref = J->chain[IR_CALLS];
  while (ref > lim) {
    IRIns *calls = IR(ref);
    if (calls->op2 == IRCALL_lj_tab_clear &&
	(ta == calls->op1 || aa_table(J, ta, calls->op1) != ALIAS_NO))
      return 0;  /* Conflict. */
    ref = calls->prev;
  }
  return 1;  /* No conflict. Can safely FOLD/CSE. */
}